

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

ostream * __thiscall
trompeloeil::call_matcher<void_(),_std::tuple<>_>::report_mismatch
          (call_matcher<void_(),_std::tuple<>_> *this,ostream *os,
          call_params_type_t<void_()> *params)

{
  bool bVar1;
  condition_base<void_()> *pcVar2;
  ulong uVar3;
  ostream *poVar4;
  char *pcVar5;
  condition_base<void_()> *cond;
  iterator __end0;
  iterator __begin0;
  condition_list<void_()> *__range3;
  call_params_type_t<void_()> *params_local;
  ostream *os_local;
  call_matcher<void_(),_std::tuple<>_> *this_local;
  
  this->reported = true;
  (*(this->super_call_matcher_base<void_()>).
    super_list_elem<trompeloeil::call_matcher_base<void_()>_>._vptr_list_elem[6])(this,os);
  bVar1 = match_parameters<>((tuple<> *)&this->field_0x78,params);
  if (bVar1) {
    __end0 = list<trompeloeil::condition_base<void_()>,_trompeloeil::delete_disposer>::begin
                       (&this->conditions);
    cond = (condition_base<void_()> *)
           list<trompeloeil::condition_base<void_()>,_trompeloeil::delete_disposer>::end
                     (&this->conditions);
    while (bVar1 = trompeloeil::operator!=(&__end0,(iterator *)&cond), bVar1) {
      pcVar2 = list<trompeloeil::condition_base<void_()>,_trompeloeil::delete_disposer>::iterator::
               operator*(&__end0);
      uVar3 = (**(code **)(*(long *)pcVar2 + 0x10))(pcVar2,params);
      if ((uVar3 & 1) == 0) {
        poVar4 = std::operator<<(os,"\n  Failed WITH(");
        pcVar5 = (char *)(**(code **)(*(long *)pcVar2 + 0x18))();
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::operator<<(poVar4,')');
      }
      list<trompeloeil::condition_base<void_()>,_trompeloeil::delete_disposer>::iterator::operator++
                (&__end0);
    }
  }
  else {
    std::operator<<(os,'\n');
    print_mismatch<>(os,(tuple<> *)&this->field_0x78,params);
  }
  return os;
}

Assistant:

std::ostream&
    report_mismatch(
      std::ostream& os,
      call_params_type_t<Sig> const & params)
    override
    {
      reported = true;
      report_signature(os);
      if (match_parameters(val, params))
      {
        for (auto& cond : conditions)
        {
          if (!cond.check(params))
          {
            os << "\n  Failed WITH(" << cond.name() << ')';
          }
        }
      }
      else
      {
        os << '\n';
        ::trompeloeil::print_mismatch(os, val, params);
      }
      return os;
    }